

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_rangeproof_sign
              (secp256k1_context *ctx,uchar *proof,size_t *plen,uint64_t min_value,
              secp256k1_pedersen_commitment *commit,uchar *blind,uchar *nonce,int exp,int min_bits,
              uint64_t value,uchar *message,size_t msg_len,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_generator *gen)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  secp256k1_fe *rzr;
  uchar uVar9;
  uchar *puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  size_t rings;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  secp256k1_gej *r;
  ulong uVar18;
  secp256k1_scalar *psVar19;
  bool bVar20;
  size_t local_6cf8;
  int overflow;
  uchar tmp [33];
  uchar tmpc [33];
  secp256k1_ge genp;
  secp256k1_fe local_6bf8;
  secp256k1_sha256 sha256_m;
  secp256k1_gej local_6b68;
  secp256k1_ge commitp;
  secp256k1_scalar stmp;
  size_t rsizes [32];
  secp256k1_fe r_2;
  size_t secidx [32];
  secp256k1_scalar sec [32];
  secp256k1_scalar k [32];
  secp256k1_scalar s [128];
  uchar prep [4096];
  secp256k1_gej pubs [128];
  
  if (proof == (uchar *)0x0) {
    secp256k1_rangeproof_sign_cold_9();
  }
  else if (plen == (size_t *)0x0) {
    secp256k1_rangeproof_sign_cold_8();
  }
  else if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_rangeproof_sign_cold_7();
  }
  else if (blind == (uchar *)0x0) {
    secp256k1_rangeproof_sign_cold_6();
  }
  else if (nonce == (uchar *)0x0) {
    secp256k1_rangeproof_sign_cold_5();
  }
  else if (msg_len == 0 || message != (uchar *)0x0) {
    if (extra_commit_len == 0 || extra_commit != (uchar *)0x0) {
      if (gen == (secp256k1_generator *)0x0) {
        secp256k1_rangeproof_sign_cold_2();
      }
      else if ((ctx->ecmult_gen_ctx).built == 0) {
        secp256k1_rangeproof_sign_cold_1();
      }
      else {
        secp256k1_pedersen_commitment_load(&commitp,commit);
        secp256k1_fe_set_b32(&genp.x,gen->data);
        secp256k1_fe_set_b32(&genp.y,gen->data + 0x20);
        genp.infinity = 0;
        if (*plen < 0x41) {
          return 0;
        }
        if (exp - 0x13U < 0xffffffec) {
          return 0;
        }
        if (0x40 < (uint)min_bits) {
          return 0;
        }
        uVar18 = value - min_value;
        if (value < min_value) {
          return 0;
        }
        rsizes[0] = 1;
        secidx[0] = 0;
        if (min_value == 0xffffffffffffffff) {
          exp = -1;
        }
        uVar9 = 0xff;
        lVar13 = 1;
        if (exp < 0) {
          lVar8 = 2;
          exp = 0;
          uVar18 = 0;
          rings = 1;
          bVar20 = false;
          min_value = value;
        }
        else {
          bVar20 = true;
          if ((min_value == 0 || -1 < (long)value) && (min_value < 0x7fffffffffffffff || value == 0)
             ) {
            if (min_value == 0) {
              uVar4 = 0x40;
            }
            else {
              lVar13 = 0x3f;
              if (min_value != 0) {
                for (; min_value >> lVar13 == 0; lVar13 = lVar13 + -1) {
                }
              }
              uVar4 = (uint)lVar13 ^ 0x3f;
            }
            if ((int)uVar4 < min_bits) {
              min_bits = uVar4;
            }
            if (0x3d < min_bits) {
              exp = 0;
            }
            if ((long)value < 0) {
              exp = 0;
            }
            uVar11 = 0;
            if (min_bits != 0) {
              uVar11 = 0xffffffffffffffff >> (-(char)min_bits & 0x3fU);
            }
            uVar6 = 0;
            if (uVar11 < 0x199999999999999a && 0 < exp) {
              do {
                uVar18 = uVar18 / 10;
                uVar4 = (int)uVar6 + 1;
                uVar6 = (ulong)uVar4;
                if (exp <= (int)uVar4) break;
                bVar20 = uVar11 < 0x28f5c28f5c28f5d;
                uVar11 = uVar11 * 10;
              } while (bVar20);
            }
            exp = (int)uVar6;
            uVar11 = uVar18;
            if (exp < 1) {
              lVar13 = 1;
            }
            else {
              lVar13 = 1;
              do {
                uVar11 = uVar11 * 10;
                lVar13 = lVar13 * 10;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
            lVar8 = 0x3f;
            if (uVar18 != 0) {
              for (; uVar18 >> lVar8 == 0; lVar8 = lVar8 + -1) {
              }
            }
            uVar4 = 1;
            if (uVar18 != 0) {
              uVar4 = ((uint)lVar8 ^ 0xffffffc0) + 0x41;
            }
            if ((int)uVar4 < min_bits) {
              uVar4 = min_bits;
            }
            uVar15 = uVar4 + 1 >> 1;
            rings = (size_t)uVar15;
            uVar6 = 0;
            lVar8 = 0;
            uVar16 = 0;
            do {
              uVar12 = (ulong)((uint)(uVar16 < rings - 1) | ~uVar4 & 1);
              *(ulong *)((long)rsizes + uVar6 * 4) = uVar12 * 2 + 2;
              lVar8 = lVar8 + 2 + uVar12 * 2;
              *(ulong *)((long)secidx + uVar6 * 4) =
                   (ulong)((uint)(uVar18 >> ((byte)uVar6 & 0x3f)) & 3);
              uVar16 = uVar16 + 1;
              uVar6 = uVar6 + 2;
            } while ((uVar15 + (rings == 0)) * 2 != uVar6);
            min_value = value - uVar11;
            uVar9 = (char)uVar4 + 0xff;
            bVar20 = false;
          }
          else {
            lVar8 = 0;
            rings = 1;
          }
        }
        if (bVar20) {
          return 0;
        }
        bVar14 = 0;
        if (1 < rsizes[0]) {
          bVar14 = (byte)exp | 0x40;
        }
        *proof = (min_value != 0) << 5 | bVar14;
        local_6cf8 = 1;
        if (1 < rsizes[0]) {
          proof[1] = uVar9;
          local_6cf8 = 2;
        }
        if (min_value != 0) {
          puVar10 = proof + local_6cf8;
          lVar7 = 0x38;
          do {
            *puVar10 = (uchar)(min_value >> ((byte)lVar7 & 0x3f));
            lVar7 = lVar7 + -8;
            puVar10 = puVar10 + 1;
          } while (lVar7 != -8);
          local_6cf8 = local_6cf8 | 8;
        }
        if ((msg_len == 0) || (msg_len <= rings * 0x80 - 0x80)) {
          uVar11 = (ulong)((uint)rings + 6 >> 3);
          if ((lVar8 + rings) * 0x20 + uVar11 <= *plen - local_6cf8) {
            sha256_m.s[0] = 0x6a09e667;
            sha256_m.s[1] = 0xbb67ae85;
            sha256_m.s[2] = 0x3c6ef372;
            sha256_m.s[3] = 0xa54ff53a;
            sha256_m.s[4] = 0x510e527f;
            sha256_m.s[5] = 0x9b05688c;
            sha256_m.s[6] = 0x1f83d9ab;
            sha256_m.s[7] = 0x5be0cd19;
            sha256_m.bytes = 0;
            s[1].d[0] = commitp.x.n[4];
            s[0].d[2] = commitp.x.n[2];
            s[0].d[3] = commitp.x.n[3];
            s[0].d[0] = commitp.x.n[0];
            s[0].d[1] = commitp.x.n[1];
            secp256k1_fe_normalize((secp256k1_fe *)s);
            iVar5 = secp256k1_fe_sqrt(&pubs[0].x,&commitp.y);
            tmp[0] = (byte)iVar5 ^ 1;
            secp256k1_fe_get_b32(tmp + 1,(secp256k1_fe *)s);
            secp256k1_sha256_write(&sha256_m,tmp,0x21);
            s[1].d[0] = genp.x.n[4];
            s[0].d[2] = genp.x.n[2];
            s[0].d[3] = genp.x.n[3];
            s[0].d[0] = genp.x.n[0];
            s[0].d[1] = genp.x.n[1];
            secp256k1_fe_normalize((secp256k1_fe *)s);
            iVar5 = secp256k1_fe_sqrt(&pubs[0].x,&genp.y);
            tmp[0] = (byte)iVar5 ^ 1;
            secp256k1_fe_get_b32(tmp + 1,(secp256k1_fe *)s);
            secp256k1_sha256_write(&sha256_m,tmp,0x21);
            secp256k1_sha256_write(&sha256_m,proof,local_6cf8);
            memset(prep,0,0x1000);
            if (message != (uchar *)0x0) {
              memcpy(prep,message,msg_len);
            }
            uVar6 = rings - 1;
            uVar16 = stmp.d[rings + 3];
            if (1 < uVar16) {
              uVar12 = (ulong)(r_2.n[rings + 4] == uVar16 - 1);
              puVar10 = prep + (uVar16 - uVar12) * 0x20 + rings * 0x80 + -0x88;
              lVar8 = 0x38;
              do {
                uVar9 = (uchar)(uVar18 >> ((byte)lVar8 & 0x3f));
                *puVar10 = uVar9;
                puVar10[-8] = uVar9;
                puVar10[-0x10] = uVar9;
                puVar10[-0x18] = '\0';
                lVar8 = lVar8 + -8;
                puVar10 = puVar10 + 1;
              } while (lVar8 != -8);
              prep[((uVar16 - 1) - uVar12) * 0x20 + uVar6 * 0x80] = 0x80;
            }
            iVar5 = secp256k1_rangeproof_genrand
                              (sec,s,prep,rsizes,rings,nonce,&commitp,proof,local_6cf8,&genp);
            if (iVar5 != 0) {
              lVar8 = 0;
              memset(prep,0,0x1000);
              sVar17 = rings;
              do {
                lVar7 = *(long *)((long)secidx + lVar8 * 2) + lVar8;
                uVar1 = s[lVar7].d[1];
                uVar2 = s[lVar7].d[2];
                uVar3 = s[lVar7].d[3];
                k[0].d[lVar8] = s[lVar7].d[0];
                k[0].d[lVar8 + 1] = uVar1;
                k[0].d[lVar8 + 2] = uVar2;
                k[0].d[lVar8 + 3] = uVar3;
                s[lVar7].d[0] = 0;
                s[lVar7].d[1] = 0;
                s[lVar7].d[2] = 0;
                s[lVar7].d[3] = 0;
                lVar8 = lVar8 + 4;
                sVar17 = sVar17 - 1;
              } while (sVar17 != 0);
              secp256k1_scalar_set_b32(&stmp,blind,&overflow);
              psVar19 = sec + uVar6;
              secp256k1_scalar_add(psVar19,psVar19,&stmp);
              if (overflow != 0) {
                return 0;
              }
              if (((sec[uVar6].d[1] == 0 && psVar19->d[0] == 0) && sec[uVar6].d[2] == 0) &&
                  sec[uVar6].d[3] == 0) {
                return 0;
              }
              puVar10 = proof + local_6cf8;
              if (1 < (uint)rings) {
                memset(puVar10,0,uVar11);
                local_6cf8 = local_6cf8 + uVar11;
              }
              uVar18 = 0;
              lVar8 = 0;
              while( true ) {
                lVar7 = lVar8;
                r = pubs + lVar7;
                sVar17 = secidx[uVar18];
                uVar4 = (int)uVar18 * 2;
                rzr = (secp256k1_fe *)(ulong)uVar4;
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,r,sec + uVar18);
                secp256k1_pedersen_ecmult_small
                          (&local_6b68,sVar17 * lVar13 << ((byte)uVar4 & 0x3f),&genp);
                secp256k1_gej_add_var(r,r,&local_6b68,rzr);
                if (pubs[lVar7].infinity != 0) break;
                if (uVar18 < uVar6) {
                  secp256k1_ge_set_gej_var((secp256k1_ge *)&local_6b68,r);
                  local_6bf8.n[4] = local_6b68.x.n[4];
                  local_6bf8.n[2] = local_6b68.x.n[2];
                  local_6bf8.n[3] = local_6b68.x.n[3];
                  local_6bf8.n[0] = local_6b68.x.n[0];
                  local_6bf8.n[1] = local_6b68.x.n[1];
                  secp256k1_fe_normalize(&local_6bf8);
                  iVar5 = secp256k1_fe_sqrt(&r_2,&local_6b68.y);
                  tmpc[0] = (byte)iVar5 ^ 1;
                  secp256k1_fe_get_b32(tmpc + 1,&local_6bf8);
                  uVar9 = tmpc[0];
                  secp256k1_sha256_write(&sha256_m,tmpc,0x21);
                  puVar10[uVar18 >> 3] = puVar10[uVar18 >> 3] | uVar9 << ((byte)uVar18 & 7);
                  *(undefined8 *)(proof + local_6cf8 + 0x10) = tmpc._17_8_;
                  *(undefined8 *)(proof + local_6cf8 + 0x10 + 8) = tmpc._25_8_;
                  *(undefined8 *)(proof + local_6cf8) = tmpc._1_8_;
                  *(undefined8 *)(proof + local_6cf8 + 8) = tmpc._9_8_;
                  local_6cf8 = local_6cf8 + 0x20;
                }
                sVar17 = rsizes[uVar18];
                lVar8 = sVar17 + lVar7;
                uVar18 = uVar18 + 1;
                if (uVar18 == rings) {
                  secp256k1_rangeproof_pub_expand(pubs,exp,rsizes,rings,&genp);
                  if (extra_commit != (uchar *)0x0) {
                    secp256k1_sha256_write(&sha256_m,extra_commit,extra_commit_len);
                  }
                  secp256k1_sha256_finalize(&sha256_m,tmp);
                  psVar19 = s;
                  iVar5 = secp256k1_borromean_sign
                                    (&ctx->ecmult_gen_ctx,proof + local_6cf8,psVar19,pubs,k,sec,
                                     rsizes,secidx,rings,tmp,0x20);
                  if (iVar5 == 0) {
                    return 0;
                  }
                  local_6cf8 = local_6cf8 + 0x20;
                  if (lVar8 != 0) {
                    lVar7 = sVar17 + lVar7;
                    do {
                      secp256k1_scalar_get_b32(proof + local_6cf8,psVar19);
                      local_6cf8 = local_6cf8 + 0x20;
                      psVar19 = psVar19 + 1;
                      lVar7 = lVar7 + -1;
                    } while (lVar7 != 0);
                  }
                  *plen = local_6cf8;
                  memset(prep,0,0x1000);
                  return 1;
                }
              }
            }
          }
        }
      }
    }
    else {
      secp256k1_rangeproof_sign_cold_3();
    }
  }
  else {
    secp256k1_rangeproof_sign_cold_4();
  }
  return 0;
}

Assistant:

int secp256k1_rangeproof_sign(const secp256k1_context* ctx, unsigned char *proof, size_t *plen, uint64_t min_value,
 const secp256k1_pedersen_commitment *commit, const unsigned char *blind, const unsigned char *nonce, int exp, int min_bits, uint64_t value,
 const unsigned char *message, size_t msg_len, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_generator* gen){
    secp256k1_ge commitp;
    secp256k1_ge genp;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(plen != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(message != NULL || msg_len == 0);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    secp256k1_pedersen_commitment_load(&commitp, commit);
    secp256k1_generator_load(&genp, gen);
    return secp256k1_rangeproof_sign_impl(&ctx->ecmult_gen_ctx,
     proof, plen, min_value, &commitp, blind, nonce, exp, min_bits, value, message, msg_len, extra_commit, extra_commit_len, &genp);
}